

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Write<short>(KDataStream *this,short T)

{
  ushort uVar1;
  byte local_19;
  
  local_19 = (byte)((ushort)T >> 8);
  uVar1 = (ushort)local_19;
  if (this->m_MachineEndian == this->m_NetEndian) {
    local_19 = (byte)T;
    T = uVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_vBuffer,&local_19);
  local_19 = (byte)T;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_vBuffer,&local_19);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}